

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-extended-kalman-filter.hxx
# Opt level: O3

StateVector * __thiscall
stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::prediction_
          (StateVector *__return_storage_ptr__,ExtendedKalmanFilter<4U,_3U,_1U> *this,uint k)

{
  DynamicsFunctorBase *pDVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  char *__function;
  long lVar6;
  ulong uVar7;
  _Elt_pointer pIVar8;
  InputVector u;
  plain_array<double,_1,_0,_0> local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  pIVar8 = (this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.u_.
           super__Deque_base<stateObservation::compileTime::IndexedMatrix<1U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<1U,_1U>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar6 = (long)pIVar8 -
          (long)(this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.u_.
                super__Deque_base<stateObservation::compileTime::IndexedMatrix<1U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<1U,_1U>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first;
  uVar5 = lVar6 >> 4;
  if ((long)uVar5 < 0) {
    uVar7 = lVar6 >> 9;
LAB_001173c2:
    pIVar8 = (this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.u_.
             super__Deque_base<stateObservation::compileTime::IndexedMatrix<1U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<1U,_1U>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar7] + uVar5 + uVar7 * -0x20;
  }
  else if (0x1f < uVar5) {
    uVar7 = uVar5 >> 5;
    goto LAB_001173c2;
  }
  if (pIVar8->isSet_ == false) {
    __function = 
    "void stateObservation::compileTime::IndexedMatrix<1, 1>::check_() const [r = 1, c = 1]";
LAB_001174c6:
    __assert_fail("isSet_ && \"Error : Matrix not initialized\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-observer-base.hxx"
                  ,0x3e,__function);
  }
  local_70.array[0] =
       (double  [1])
       (pIVar8->v_).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
       array[0];
  if (((this->xbar_).isSet_ != true) || ((this->xbar_).k_ != k)) {
    pDVar1 = this->f_;
    if (pDVar1 == (DynamicsFunctorBase *)0x0) {
      __assert_fail("f_!=0x0 && \"ERROR: The Kalman filter functor is not set\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-extended-kalman-filter.hxx"
                    ,0x23,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::ExtendedKalmanFilter<4, 3, 1>::prediction_(unsigned int) [n = 4, m = 3, p = 1]"
                   );
    }
    if ((this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.x_.isSet_ ==
        false) {
      __function = 
      "void stateObservation::compileTime::IndexedMatrix<4, 1>::check_() const [r = 4, c = 1]";
      goto LAB_001174c6;
    }
    local_68 = *(undefined4 *)
                (this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.x_.v_
                .super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    ;
    uStack_64 = *(undefined4 *)
                 ((long)(this->super_KalmanFilterBase<4U,_3U,_1U>).
                        super_ZeroDelayObserver<4U,_3U,_1U>.x_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 4);
    uStack_60 = *(undefined4 *)
                 ((this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.x_.
                  v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 1);
    uStack_5c = *(undefined4 *)
                 ((long)(this->super_KalmanFilterBase<4U,_3U,_1U>).
                        super_ZeroDelayObserver<4U,_3U,_1U>.x_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 0xc);
    local_58 = *(undefined4 *)
                ((this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.x_.
                 v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                 array + 2);
    uStack_54 = *(undefined4 *)
                 ((long)(this->super_KalmanFilterBase<4U,_3U,_1U>).
                        super_ZeroDelayObserver<4U,_3U,_1U>.x_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 0x14);
    uStack_50 = *(undefined4 *)
                 ((this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>.x_.
                  v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 3);
    uStack_4c = *(undefined4 *)
                 ((long)(this->super_KalmanFilterBase<4U,_3U,_1U>).
                        super_ZeroDelayObserver<4U,_3U,_1U>.x_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 0x1c);
    (**pDVar1->_vptr_DynamicsFunctorBase)
              (&local_48,pDVar1,&local_68,&local_70,
               (ulong)(this->super_KalmanFilterBase<4U,_3U,_1U>).super_ZeroDelayObserver<4U,_3U,_1U>
                      .x_.k_);
    (this->xbar_).k_ = k;
    (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
    array[0] = local_48;
    (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
    array[1] = dStack_40;
    (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
    array[2] = local_38;
    (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
    array[3] = dStack_30;
    (this->xbar_).isSet_ = true;
  }
  dVar2 = (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[0];
  dVar3 = (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[1];
  dVar4 = (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array[3];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[2] =
       (this->xbar_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[2];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[3] = dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[0] = dVar2;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[1] = dVar3;
  return __return_storage_ptr__;
}

Assistant:

typename ObserverBase<n,m,p>::StateVector ExtendedKalmanFilter<n,m,p>::prediction_(unsigned k)
{
    typename ObserverBase<n,m,p>::InputVector u;

    if (p>0)
        u=this->u_[0]();


    if (!this->xbar_.isSet() || this->xbar_.getTime()!=k)
    {
        BOOST_ASSERT (f_!=0x0 && "ERROR: The Kalman filter functor is not set");
        xbar_.set(f_->stateDynamics(
                      this->x_(),
                      u,
                      this->x_.getTime()),
                  k);
    }
    return xbar_();
}